

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

CRef __thiscall
Minisat::ClauseAllocator::alloc(ClauseAllocator *this,vec<Minisat::Lit,_int> *ps,bool learnt)

{
  bool use_extra;
  Ref RVar1;
  
  use_extra = (bool)(this->extra_clause_field | learnt);
  RVar1 = RegionAllocator<unsigned_int>::alloc(&this->ra,ps->sz + (uint)use_extra + 1);
  if (RVar1 < (this->ra).sz) {
    Clause::Clause((Clause *)((this->ra).memory + RVar1),ps,use_extra,learnt);
    return RVar1;
  }
  __assert_fail("r < sz",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/Alloc.h"
                ,0x42,"T *Minisat::RegionAllocator<unsigned int>::lea(Ref) [T = unsigned int]");
}

Assistant:

CRef alloc(const vec<Lit>& ps, bool learnt = false)
    {
        assert(sizeof(Lit)      == sizeof(uint32_t));
        assert(sizeof(float)    == sizeof(uint32_t));
        bool use_extra = learnt | extra_clause_field;
        CRef cid       = ra.alloc(clauseWord32Size(ps.size(), use_extra));
        new (lea(cid)) Clause(ps, use_extra, learnt);

        return cid;
    }